

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::operator==
          (GED_EnhancedGroundCombatSoldier *this,GED_EnhancedGroundCombatSoldier *Value)

{
  KBOOL KVar1;
  
  KVar1 = GED_BasicGroundCombatSoldier::operator!=
                    (&this->super_GED_BasicGroundCombatSoldier,
                     &Value->super_GED_BasicGroundCombatSoldier);
  if ((((KVar1) || (this->m_ui8WaterStatus != Value->m_ui8WaterStatus)) ||
      (this->m_ui8RestStatus != Value->m_ui8RestStatus)) ||
     (this->m_ui8PriAmmun != Value->m_ui8PriAmmun)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui8SecAmmun == Value->m_ui8SecAmmun;
  }
  return KVar1;
}

Assistant:

KBOOL GED_EnhancedGroundCombatSoldier::operator == ( const GED_EnhancedGroundCombatSoldier & Value ) const
{
    if( GED_BasicGroundCombatSoldier::operator!=( Value ) ) return false;
    if( m_ui8WaterStatus  != Value.m_ui8WaterStatus )       return false;
    if( m_ui8RestStatus   != Value.m_ui8RestStatus )        return false;
    if( m_ui8PriAmmun     != Value.m_ui8PriAmmun )          return false;
    if( m_ui8SecAmmun     != Value.m_ui8SecAmmun )          return false;
    return true;
}